

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void update_effects(DUMB_IT_SIGRENDERER *sigrenderer)

{
  IT_CHANNEL *channel;
  char *pcVar1;
  char cVar2;
  IT_PLAYING *pIVar3;
  byte bVar4;
  int iVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  long lVar12;
  IT_SAMPLE *sample;
  int iVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  
  bVar11 = sigrenderer->globalvolslide;
  if ((bVar11 != 0) &&
     (bVar6 = sigrenderer->globalvolume + bVar11, sigrenderer->globalvolume = bVar6, 0x80 < bVar6))
  {
    sigrenderer->globalvolume = ~bVar11 & 0x80;
  }
  cVar2 = sigrenderer->temposlide;
  if ((cVar2 != '\0') &&
     (iVar8 = sigrenderer->tempo + (int)cVar2, sigrenderer->tempo = iVar8, iVar8 < 0x20)) {
    iVar8 = 0xff;
    if (cVar2 < '\0') {
      iVar8 = 0x20;
    }
    sigrenderer->tempo = iVar8;
  }
  lVar12 = 0;
  do {
    if (lVar12 == 0x2800) {
      for (lVar12 = 0x504; lVar12 != 0x5c4; lVar12 = lVar12 + 1) {
        pIVar3 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar12 * 8 + -0x50);
        if (pIVar3 != (IT_PLAYING *)0x0) {
          update_playing_effects(pIVar3);
        }
      }
      update_smooth_effects(sigrenderer);
      return;
    }
    bVar11 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2a];
    if ((bVar11 != 0) &&
       (bVar6 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] + bVar11,
       sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] = bVar6, 0x40 < bVar6)) {
      sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] = (byte)~bVar11 >> 1 & 0x40;
    }
    cVar2 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2b];
    if (cVar2 != '\0') {
      uVar9 = 0x40 - (((uint)sigrenderer->sigdata->flags >> 8 & 1) != 0);
      bVar11 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] + cVar2;
      sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] = bVar11;
      if (uVar9 < bVar11) {
        cVar7 = (char)uVar9;
        if (cVar2 < '\0') {
          cVar7 = '\0';
        }
        sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] = cVar7;
      }
    }
    bVar11 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x29];
    if (bVar11 != 0) {
      bVar6 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x28];
      if ((sigrenderer->sigdata->flags & 0x40) == 0) {
        if (0x40 < bVar6) {
          bVar6 = 0x20;
        }
        bVar4 = (byte)~bVar11 >> 1 & 0x40;
        if ((byte)(bVar6 + bVar11) < 0x41) {
          bVar4 = bVar6 + bVar11;
        }
        sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x28] = bVar4;
        iVar8 = (uint)bVar4 << 8;
      }
      else {
        if (0x40 < bVar6) {
          sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x28] = ' ';
          pcVar1 = sigrenderer->channel[0].arpeggio_offsets + lVar12 + -0x26;
          pcVar1[0] = ' ';
          pcVar1[1] = ' ';
        }
        iVar8 = (char)bVar11 * 0x40 +
                (uint)*(ushort *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + -0x26);
        if (0x3fdf < iVar8) {
          iVar8 = 0x3fe0;
        }
        if (iVar8 < 0x21) {
          iVar8 = 0x20;
        }
      }
      *(short *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + -0x26) = (short)iVar8;
    }
    bVar11 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x23];
    if ((bVar11 != 0) &&
       (bVar6 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x24] + bVar11,
       sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x24] = bVar6, 0x40 < bVar6)) {
      sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x24] = (byte)~bVar11 >> 1 & 0x40;
    }
    channel = (IT_CHANNEL *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + -0x30);
    pIVar3 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + 0x58);
    update_tremor(channel);
    update_retrig(sigrenderer,channel);
    if (sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x4d] != '\0') {
      if (pIVar3 == (IT_PLAYING *)0x0) {
        sample = (IT_SAMPLE *)0x0;
      }
      else {
        sample = pIVar3->sample;
      }
      update_invert_loop(channel,sample);
    }
    if (pIVar3 != (IT_PLAYING *)0x0) {
      iVar13 = pIVar3->slide + *(int *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + 0x18);
      pIVar3->slide = iVar13;
      iVar8 = *(int *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + 0x1c);
      if ((sigrenderer->sigdata->flags & 8) == 0) {
        if (iVar8 != 0) {
          bVar11 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x29];
          if (bVar11 < 0x78) {
            fVar14 = (float)pIVar3->sample->C5_speed * 1.7621046e-08;
            dVar16 = exp2((double)(int)(0x3c - (uint)pIVar3->note) * 0.0833333333333334);
            fVar17 = (float)dVar16;
            dVar16 = exp2((double)(int)(0x3c - (uint)bVar11) * 0.0833333333333334);
            fVar15 = (float)dVar16;
            if (fVar15 <= fVar17 - (float)iVar13 * fVar14) {
              pIVar3->slide = iVar8 + iVar13;
              if (fVar17 - fVar14 * (float)(iVar8 + iVar13) < fVar15) goto LAB_00582be7;
            }
            else {
              pIVar3->slide = iVar13 - iVar8;
              if (fVar15 < fVar17 - fVar14 * (float)(iVar13 - iVar8)) {
LAB_00582be7:
                pIVar3->note = bVar11;
                pIVar3->slide = 0;
                sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x29] = -1;
              }
            }
          }
        }
      }
      else if ((iVar8 != 0) &&
              (bVar11 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x29], bVar11 < 0x78)) {
        iVar5 = (uint)pIVar3->note * 0x100;
        iVar13 = iVar5 + iVar13 + -0x3c00;
        iVar10 = (uint)bVar11 * 0x100 + -0x3c00;
        if (iVar10 < iVar13) {
          iVar13 = iVar13 - iVar8;
          if (iVar13 < iVar10) {
LAB_00582c00:
            sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x29] = -1;
            iVar13 = iVar10;
          }
        }
        else if ((iVar13 < iVar10) && (iVar13 = iVar13 + iVar8, iVar10 < iVar13)) goto LAB_00582c00;
        pIVar3->slide = iVar13 - (iVar5 + -0x3c00);
      }
      update_playing_effects(pIVar3);
    }
    lVar12 = lVar12 + 0xa0;
  } while( true );
}

Assistant:

static void update_effects(DUMB_IT_SIGRENDERER *sigrenderer)
{
    int i;

	if (sigrenderer->globalvolslide) {
		sigrenderer->globalvolume += sigrenderer->globalvolslide;
		if (sigrenderer->globalvolume > 128) {
			if (sigrenderer->globalvolslide >= 0)
				sigrenderer->globalvolume = 128;
			else
				sigrenderer->globalvolume = 0;
		}
	}

	if (sigrenderer->temposlide) {
		sigrenderer->tempo += sigrenderer->temposlide;
		if (sigrenderer->tempo < 32) {
			if (sigrenderer->temposlide >= 0)
				sigrenderer->tempo = 255;
			else
				sigrenderer->tempo = 32;
		}
	}

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];
		IT_PLAYING *playing = channel->playing;

		if (channel->xm_volslide) {
			channel->volume += channel->xm_volslide;
			if (channel->volume > 64) {
				if (channel->xm_volslide >= 0)
					channel->volume = 64;
				else
					channel->volume = 0;
			}
		}

		if (channel->volslide) {
			int clip = (sigrenderer->sigdata->flags & IT_WAS_AN_S3M) ? 63 : 64;
			channel->volume += channel->volslide;
			if (channel->volume > clip) {
				if (channel->volslide >= 0)
					channel->volume = clip;
				else
					channel->volume = 0;
			}
		}

		if (channel->panslide) {
			if (sigrenderer->sigdata->flags & IT_WAS_AN_XM) {
				if (IT_IS_SURROUND(channel->pan))
				{
					channel->pan = 32;
					channel->truepan = 32 + 128 * 64;
				}
				if (channel->panslide == -128)
					channel->truepan = 32;
				else
					channel->truepan = MID(32, channel->truepan + channel->panslide*64, 32+255*64);
			} else {
				if (IT_IS_SURROUND(channel->pan))
				{
					channel->pan = 32;
				}
				channel->pan += channel->panslide;
				if (channel->pan > 64) {
					if (channel->panslide >= 0)
						channel->pan = 64;
					else
						channel->pan = 0;
				}
				channel->truepan = channel->pan << IT_ENVELOPE_SHIFT;
			}
		}

		if (channel->channelvolslide) {
			channel->channelvolume += channel->channelvolslide;
			if (channel->channelvolume > 64) {
				if (channel->channelvolslide >= 0)
					channel->channelvolume = 64;
				else
					channel->channelvolume = 0;
			}
		}

		update_tremor(channel);

		update_retrig(sigrenderer, channel);

		if (channel->inv_loop_speed) update_invert_loop(channel, playing ? playing->sample : NULL);

		if (playing) {
			playing->slide += channel->portamento;

			if (sigrenderer->sigdata->flags & IT_LINEAR_SLIDES) {
				if (channel->toneporta && channel->destnote < 120) {
					int currpitch = ((playing->note - 60) << 8) + playing->slide;
					int destpitch = (channel->destnote - 60) << 8;
					if (currpitch > destpitch) {
						currpitch -= channel->toneporta;
						if (currpitch < destpitch) {
							currpitch = destpitch;
							channel->destnote = IT_NOTE_OFF;
						}
					} else if (currpitch < destpitch) {
						currpitch += channel->toneporta;
						if (currpitch > destpitch) {
							currpitch = destpitch;
							channel->destnote = IT_NOTE_OFF;
						}
					}
					playing->slide = currpitch - ((playing->note - 60) << 8);
				}
			} else {
				if (channel->toneporta && channel->destnote < 120) {
					float amiga_multiplier = playing->sample->C5_speed * (1.0f / AMIGA_DIVISOR);

					float deltanote = (float)pow(DUMB_SEMITONE_BASE, 60 - playing->note);
					/* deltanote is 1.0 for C-5, 0.5 for C-6, etc. */

					float deltaslid = deltanote - playing->slide * amiga_multiplier;

					float destdelta = (float)pow(DUMB_SEMITONE_BASE, 60 - channel->destnote);
					if (deltaslid < destdelta) {
						playing->slide -= channel->toneporta;
						deltaslid = deltanote - playing->slide * amiga_multiplier;
						if (deltaslid > destdelta) {
							playing->note = channel->destnote;
							playing->slide = 0;
							channel->destnote = IT_NOTE_OFF;
						}
					} else {
						playing->slide += channel->toneporta;
						deltaslid = deltanote - playing->slide * amiga_multiplier;
						if (deltaslid < destdelta) {
							playing->note = channel->destnote;
							playing->slide = 0;
							channel->destnote = IT_NOTE_OFF;
						}
					}
				}
			}

			update_playing_effects(playing);
		}
	}

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
		IT_PLAYING *playing = sigrenderer->playing[i];
		if (playing) update_playing_effects(playing);
	}

	update_smooth_effects(sigrenderer);
}